

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O0

void __thiscall ABlasterFX1::Effect(ABlasterFX1 *this)

{
  int iVar1;
  double dVar2;
  DVector3 local_30;
  FName local_14;
  ABlasterFX1 *local_10;
  ABlasterFX1 *this_local;
  
  local_10 = this;
  iVar1 = FRandom::operator()(&pr_bfx1t);
  if (iVar1 < 0x40) {
    FName::FName(&local_14,"BlasterSmoke");
    dVar2 = AActor::Z((AActor *)this);
    dVar2 = MAX<double>(dVar2 - 8.0,(this->super_AFastProjectile).super_AActor.floorz);
    AActor::PosAtZ(&local_30,(AActor *)this,dVar2);
    Spawn(&local_14,&local_30,ALLOW_REPLACE);
  }
  return;
}

Assistant:

void ABlasterFX1::Effect ()
{
	if (pr_bfx1t() < 64)
	{
		Spawn("BlasterSmoke", PosAtZ(MAX(Z() - 8., floorz)), ALLOW_REPLACE);
	}
}